

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByName(DescriptorPool *this,ConstStringParam name)

{
  bool bVar1;
  pointer this_00;
  StringPiece local_40;
  Symbol local_30;
  DescriptorPool *local_28;
  FieldDescriptor *field;
  ConstStringParam name_local;
  DescriptorPool *this_local;
  
  field = (FieldDescriptor *)name;
  name_local = (ConstStringParam)this;
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->tables_);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field);
  local_30 = Tables::FindByNameHelper(this_00,this,local_40);
  local_28 = (DescriptorPool *)Symbol::field_descriptor(&local_30);
  if ((local_28 == (DescriptorPool *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension((FieldDescriptor *)local_28), !bVar1)) {
    this_local = (DescriptorPool *)0x0;
  }
  else {
    this_local = local_28;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByName(
    ConstStringParam name) const {
  if (const FieldDescriptor* field =
          tables_->FindByNameHelper(this, name).field_descriptor()) {
    if (field->is_extension()) {
      return field;
    }
  }
  return nullptr;
}